

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
* deqp::egl::SurfaceConfig::getDefaultRules(void)

{
  mapped_type *pmVar1;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  *in_RDI;
  key_type_conflict local_2e0;
  AttribRule local_2dc;
  key_type_conflict local_2cc;
  AttribRule local_2c8;
  key_type_conflict local_2b8;
  AttribRule local_2b4;
  key_type_conflict local_2a4;
  AttribRule local_2a0;
  key_type_conflict local_290;
  AttribRule local_28c;
  key_type_conflict local_27c;
  AttribRule local_278;
  key_type_conflict local_268;
  AttribRule local_264;
  key_type_conflict local_254;
  AttribRule local_250;
  key_type_conflict local_240;
  AttribRule local_23c;
  key_type_conflict local_22c;
  AttribRule local_228;
  key_type_conflict local_218;
  AttribRule local_214;
  key_type_conflict local_204;
  AttribRule local_200;
  key_type_conflict local_1f0;
  AttribRule local_1ec;
  key_type_conflict local_1dc;
  AttribRule local_1d8;
  key_type_conflict local_1c8;
  AttribRule local_1c4;
  key_type_conflict local_1b4;
  AttribRule local_1b0;
  key_type_conflict local_1a0;
  AttribRule local_19c;
  key_type_conflict local_18c;
  AttribRule local_188;
  key_type_conflict local_178;
  AttribRule local_174;
  key_type_conflict local_164;
  AttribRule local_160;
  key_type_conflict local_150;
  AttribRule local_14c;
  key_type_conflict local_13c;
  AttribRule local_138;
  key_type_conflict local_128;
  AttribRule local_124;
  key_type_conflict local_114;
  AttribRule local_110;
  key_type_conflict local_100;
  AttribRule local_fc;
  key_type_conflict local_ec;
  AttribRule local_e8;
  key_type_conflict local_d8;
  AttribRule local_d4;
  key_type_conflict local_c4;
  AttribRule local_c0;
  key_type_conflict local_b0;
  AttribRule local_ac;
  key_type_conflict local_9c;
  AttribRule local_98;
  key_type_conflict local_88;
  AttribRule local_84;
  key_type_conflict local_74;
  AttribRule local_70;
  key_type_conflict local_60;
  AttribRule local_5c;
  key_type_conflict local_4c;
  AttribRule local_48;
  key_type_conflict local_38 [5];
  AttribRule local_24;
  undefined1 local_11;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  *rules;
  
  local_11 = 0;
  std::
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::map(in_RDI);
  AttribRule::AttribRule(&local_24,0x3020,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_38[0] = 0x3020;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,local_38);
  pmVar1->name = local_24.name;
  pmVar1->value = local_24.value;
  pmVar1->criteria = local_24.criteria;
  pmVar1->sortOrder = local_24.sortOrder;
  AttribRule::AttribRule(&local_48,0x3024,0,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_4c = 0x3024;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_4c);
  pmVar1->name = local_48.name;
  pmVar1->value = local_48.value;
  pmVar1->criteria = local_48.criteria;
  pmVar1->sortOrder = local_48.sortOrder;
  AttribRule::AttribRule(&local_5c,0x3023,0,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_60 = 0x3023;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_60);
  pmVar1->name = local_5c.name;
  pmVar1->value = local_5c.value;
  pmVar1->criteria = local_5c.criteria;
  pmVar1->sortOrder = local_5c.sortOrder;
  AttribRule::AttribRule(&local_70,0x3022,0,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_74 = 0x3022;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_74);
  pmVar1->name = local_70.name;
  pmVar1->value = local_70.value;
  pmVar1->criteria = local_70.criteria;
  pmVar1->sortOrder = local_70.sortOrder;
  AttribRule::AttribRule(&local_84,0x303d,0,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_88 = 0x303d;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_88);
  pmVar1->name = local_84.name;
  pmVar1->value = local_84.value;
  pmVar1->criteria = local_84.criteria;
  pmVar1->sortOrder = local_84.sortOrder;
  AttribRule::AttribRule(&local_98,0x3021,0,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_9c = 0x3021;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_9c);
  pmVar1->name = local_98.name;
  pmVar1->value = local_98.value;
  pmVar1->criteria = local_98.criteria;
  pmVar1->sortOrder = local_98.sortOrder;
  AttribRule::AttribRule(&local_ac,0x303e,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_b0 = 0x303e;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_b0);
  pmVar1->name = local_ac.name;
  pmVar1->value = local_ac.value;
  pmVar1->criteria = local_ac.criteria;
  pmVar1->sortOrder = local_ac.sortOrder;
  AttribRule::AttribRule(&local_c0,0x3039,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_c4 = 0x3039;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_c4);
  pmVar1->name = local_c0.name;
  pmVar1->value = local_c0.value;
  pmVar1->criteria = local_c0.criteria;
  pmVar1->sortOrder = local_c0.sortOrder;
  AttribRule::AttribRule(&local_d4,0x303a,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_d8 = 0x303a;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_d8);
  pmVar1->name = local_d4.name;
  pmVar1->value = local_d4.value;
  pmVar1->criteria = local_d4.criteria;
  pmVar1->sortOrder = local_d4.sortOrder;
  AttribRule::AttribRule(&local_e8,0x303f,0x308e,CRITERIA_EXACT,SORTORDER_NONE);
  local_ec = 0x303f;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_ec);
  pmVar1->name = local_e8.name;
  pmVar1->value = local_e8.value;
  pmVar1->criteria = local_e8.criteria;
  pmVar1->sortOrder = local_e8.sortOrder;
  AttribRule::AttribRule(&local_fc,0x3027,-1,CRITERIA_EXACT,SORTORDER_SPECIAL);
  local_100 = 0x3027;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_100);
  pmVar1->name = local_fc.name;
  pmVar1->value = local_fc.value;
  pmVar1->criteria = local_fc.criteria;
  pmVar1->sortOrder = local_fc.sortOrder;
  AttribRule::AttribRule(&local_110,0x3028,-1,CRITERIA_EXACT,SORTORDER_SMALLER);
  local_114 = 0x3028;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_114);
  pmVar1->name = local_110.name;
  pmVar1->value = local_110.value;
  pmVar1->criteria = local_110.criteria;
  pmVar1->sortOrder = local_110.sortOrder;
  AttribRule::AttribRule(&local_124,0x3042,0,CRITERIA_MASK,SORTORDER_NONE);
  local_128 = 0x3042;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_128);
  pmVar1->name = local_124.name;
  pmVar1->value = local_124.value;
  pmVar1->criteria = local_124.criteria;
  pmVar1->sortOrder = local_124.sortOrder;
  AttribRule::AttribRule(&local_138,0x3025,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_13c = 0x3025;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_13c);
  pmVar1->name = local_138.name;
  pmVar1->value = local_138.value;
  pmVar1->criteria = local_138.criteria;
  pmVar1->sortOrder = local_138.sortOrder;
  AttribRule::AttribRule(&local_14c,0x3029,0,CRITERIA_EXACT,SORTORDER_NONE);
  local_150 = 0x3029;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_150);
  pmVar1->name = local_14c.name;
  pmVar1->value = local_14c.value;
  pmVar1->criteria = local_14c.criteria;
  pmVar1->sortOrder = local_14c.sortOrder;
  AttribRule::AttribRule(&local_160,0x303c,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_164 = 0x303c;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_164);
  pmVar1->name = local_160.name;
  pmVar1->value = local_160.value;
  pmVar1->criteria = local_160.criteria;
  pmVar1->sortOrder = local_160.sortOrder;
  AttribRule::AttribRule(&local_174,0x303b,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_178 = 0x303b;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_178);
  pmVar1->name = local_174.name;
  pmVar1->value = local_174.value;
  pmVar1->criteria = local_174.criteria;
  pmVar1->sortOrder = local_174.sortOrder;
  AttribRule::AttribRule(&local_188,0x302d,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_18c = 0x302d;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_18c);
  pmVar1->name = local_188.name;
  pmVar1->value = local_188.value;
  pmVar1->criteria = local_188.criteria;
  pmVar1->sortOrder = local_188.sortOrder;
  AttribRule::AttribRule(&local_19c,0x302f,-1,CRITERIA_EXACT,SORTORDER_SPECIAL);
  local_1a0 = 0x302f;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_1a0);
  pmVar1->name = local_19c.name;
  pmVar1->value = local_19c.value;
  pmVar1->criteria = local_19c.criteria;
  pmVar1->sortOrder = local_19c.sortOrder;
  AttribRule::AttribRule(&local_1b0,0x3040,1,CRITERIA_MASK,SORTORDER_NONE);
  local_1b4 = 0x3040;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_1b4);
  pmVar1->name = local_1b0.name;
  pmVar1->value = local_1b0.value;
  pmVar1->criteria = local_1b0.criteria;
  pmVar1->sortOrder = local_1b0.sortOrder;
  AttribRule::AttribRule(&local_1c4,0x3032,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_1c8 = 0x3032;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_1c8);
  pmVar1->name = local_1c4.name;
  pmVar1->value = local_1c4.value;
  pmVar1->criteria = local_1c4.criteria;
  pmVar1->sortOrder = local_1c4.sortOrder;
  AttribRule::AttribRule(&local_1d8,0x3031,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_1dc = 0x3031;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_1dc);
  pmVar1->name = local_1d8.name;
  pmVar1->value = local_1d8.value;
  pmVar1->criteria = local_1d8.criteria;
  pmVar1->sortOrder = local_1d8.sortOrder;
  AttribRule::AttribRule(&local_1ec,0x3026,0,CRITERIA_AT_LEAST,SORTORDER_SMALLER);
  local_1f0 = 0x3026;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_1f0);
  pmVar1->name = local_1ec.name;
  pmVar1->value = local_1ec.value;
  pmVar1->criteria = local_1ec.criteria;
  pmVar1->sortOrder = local_1ec.sortOrder;
  AttribRule::AttribRule(&local_200,0x3033,4,CRITERIA_MASK,SORTORDER_NONE);
  local_204 = 0x3033;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_204);
  pmVar1->name = local_200.name;
  pmVar1->value = local_200.value;
  pmVar1->criteria = local_200.criteria;
  pmVar1->sortOrder = local_200.sortOrder;
  AttribRule::AttribRule(&local_214,0x3034,0x3038,CRITERIA_EXACT,SORTORDER_NONE);
  local_218 = 0x3034;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_218);
  pmVar1->name = local_214.name;
  pmVar1->value = local_214.value;
  pmVar1->criteria = local_214.criteria;
  pmVar1->sortOrder = local_214.sortOrder;
  AttribRule::AttribRule(&local_228,0x3037,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_22c = 0x3037;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_22c);
  pmVar1->name = local_228.name;
  pmVar1->value = local_228.value;
  pmVar1->criteria = local_228.criteria;
  pmVar1->sortOrder = local_228.sortOrder;
  AttribRule::AttribRule(&local_23c,0x3036,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_240 = 0x3036;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_240);
  pmVar1->name = local_23c.name;
  pmVar1->value = local_23c.value;
  pmVar1->criteria = local_23c.criteria;
  pmVar1->sortOrder = local_23c.sortOrder;
  AttribRule::AttribRule(&local_250,0x3035,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_254 = 0x3035;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_254);
  pmVar1->name = local_250.name;
  pmVar1->value = local_250.value;
  pmVar1->criteria = local_250.criteria;
  pmVar1->sortOrder = local_250.sortOrder;
  AttribRule::AttribRule(&local_264,0x3301,-1,CRITERIA_EXACT,SORTORDER_SPECIAL);
  local_268 = 0x3301;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_268);
  pmVar1->name = local_264.name;
  pmVar1->value = local_264.value;
  pmVar1->criteria = local_264.criteria;
  pmVar1->sortOrder = local_264.sortOrder;
  AttribRule::AttribRule(&local_278,0x3311,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_27c = 0x3311;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_27c);
  pmVar1->name = local_278.name;
  pmVar1->value = local_278.value;
  pmVar1->criteria = local_278.criteria;
  pmVar1->sortOrder = local_278.sortOrder;
  AttribRule::AttribRule(&local_28c,0x3312,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_290 = 0x3312;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_290);
  pmVar1->name = local_28c.name;
  pmVar1->value = local_28c.value;
  pmVar1->criteria = local_28c.criteria;
  pmVar1->sortOrder = local_28c.sortOrder;
  AttribRule::AttribRule(&local_2a0,0x3317,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_2a4 = 0x3317;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_2a4);
  pmVar1->name = local_2a0.name;
  pmVar1->value = local_2a0.value;
  pmVar1->criteria = local_2a0.criteria;
  pmVar1->sortOrder = local_2a0.sortOrder;
  AttribRule::AttribRule(&local_2b4,0x330a,-1,CRITERIA_EXACT,SORTORDER_NONE);
  local_2b8 = 0x330a;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_2b8);
  pmVar1->name = local_2b4.name;
  pmVar1->value = local_2b4.value;
  pmVar1->criteria = local_2b4.criteria;
  pmVar1->sortOrder = local_2b4.sortOrder;
  AttribRule::AttribRule(&local_2c8,0x331a,-1,CRITERIA_AT_LEAST,SORTORDER_SPECIAL);
  local_2cc = 0x331a;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_2cc);
  pmVar1->name = local_2c8.name;
  pmVar1->value = local_2c8.value;
  pmVar1->criteria = local_2c8.criteria;
  pmVar1->sortOrder = local_2c8.sortOrder;
  AttribRule::AttribRule(&local_2dc,0x3339,0x333a,CRITERIA_EXACT,SORTORDER_SPECIAL);
  local_2e0 = 0x3339;
  pmVar1 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_2e0);
  pmVar1->name = local_2dc.name;
  pmVar1->value = local_2dc.value;
  pmVar1->criteria = local_2dc.criteria;
  pmVar1->sortOrder = local_2dc.sortOrder;
  return in_RDI;
}

Assistant:

static std::map<EGLenum, AttribRule> getDefaultRules (void)
	{
		// \todo [2011-03-24 pyry] From EGL 1.4 spec - check that this is valid for other versions as well
		std::map<EGLenum, AttribRule> rules;

		//									Attribute									Default				Selection Criteria	Sort Order			Sort Priority
		rules[EGL_BUFFER_SIZE]				= AttribRule(EGL_BUFFER_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	4
		rules[EGL_RED_SIZE]					= AttribRule(EGL_RED_SIZE,					0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_GREEN_SIZE]				= AttribRule(EGL_GREEN_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_BLUE_SIZE]				= AttribRule(EGL_BLUE_SIZE,					0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_LUMINANCE_SIZE]			= AttribRule(EGL_LUMINANCE_SIZE,			0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_ALPHA_SIZE]				= AttribRule(EGL_ALPHA_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_ALPHA_MASK_SIZE]			= AttribRule(EGL_ALPHA_MASK_SIZE,			0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	9
		rules[EGL_BIND_TO_TEXTURE_RGB]		= AttribRule(EGL_BIND_TO_TEXTURE_RGB,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_BIND_TO_TEXTURE_RGBA]		= AttribRule(EGL_BIND_TO_TEXTURE_RGBA,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_COLOR_BUFFER_TYPE]		= AttribRule(EGL_COLOR_BUFFER_TYPE,			EGL_RGB_BUFFER,		CRITERIA_EXACT,		SORTORDER_NONE);	//	2
		rules[EGL_CONFIG_CAVEAT]			= AttribRule(EGL_CONFIG_CAVEAT,				EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	1
		rules[EGL_CONFIG_ID]				= AttribRule(EGL_CONFIG_ID,					EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SMALLER);	//	11
		rules[EGL_CONFORMANT]				= AttribRule(EGL_CONFORMANT,				0,					CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_DEPTH_SIZE]				= AttribRule(EGL_DEPTH_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	7
		rules[EGL_LEVEL]					= AttribRule(EGL_LEVEL,						0,					CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_MAX_SWAP_INTERVAL]		= AttribRule(EGL_MAX_SWAP_INTERVAL,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_MIN_SWAP_INTERVAL]		= AttribRule(EGL_MIN_SWAP_INTERVAL,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_NATIVE_RENDERABLE]		= AttribRule(EGL_NATIVE_RENDERABLE,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_NATIVE_VISUAL_TYPE]		= AttribRule(EGL_NATIVE_VISUAL_TYPE,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	10
		rules[EGL_RENDERABLE_TYPE]			= AttribRule(EGL_RENDERABLE_TYPE,			EGL_OPENGL_ES_BIT,	CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_SAMPLE_BUFFERS]			= AttribRule(EGL_SAMPLE_BUFFERS,			0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	5
		rules[EGL_SAMPLES]					= AttribRule(EGL_SAMPLES,					0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	6
		rules[EGL_STENCIL_SIZE]				= AttribRule(EGL_STENCIL_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	8
		rules[EGL_SURFACE_TYPE]				= AttribRule(EGL_SURFACE_TYPE,				EGL_WINDOW_BIT,		CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_TYPE]			= AttribRule(EGL_TRANSPARENT_TYPE,			EGL_NONE,			CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_RED_VALUE]	= AttribRule(EGL_TRANSPARENT_RED_VALUE,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_GREEN_VALUE]	= AttribRule(EGL_TRANSPARENT_GREEN_VALUE,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_BLUE_VALUE]	= AttribRule(EGL_TRANSPARENT_BLUE_VALUE,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);

		// EGL_EXT_yuv_surface
		rules[EGL_YUV_ORDER_EXT]			= AttribRule(EGL_YUV_ORDER_EXT,				EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);
		rules[EGL_YUV_NUMBER_OF_PLANES_EXT]	= AttribRule(EGL_YUV_NUMBER_OF_PLANES_EXT,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_SUBSAMPLE_EXT]		= AttribRule(EGL_YUV_SUBSAMPLE_EXT,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_DEPTH_RANGE_EXT]		= AttribRule(EGL_YUV_DEPTH_RANGE_EXT,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_CSC_STANDARD_EXT]		= AttribRule(EGL_YUV_CSC_STANDARD_EXT,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_PLANE_BPP_EXT]		= AttribRule(EGL_YUV_PLANE_BPP_EXT,			EGL_DONT_CARE,		CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3

		// EGL_EXT_pixel_format_float
		rules[EGL_COLOR_COMPONENT_TYPE_EXT]	= AttribRule(EGL_COLOR_COMPONENT_TYPE_EXT,	EGL_COLOR_COMPONENT_TYPE_FIXED_EXT,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	2

		return rules;
	}